

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

uint CountLeadingZeros_32(uint32_t Value)

{
  uint uVar1;
  uint Count;
  uint32_t Value_local;
  
  if (Value == 0) {
    Count = 0x20;
  }
  else {
    uVar1 = 0x1f;
    if (Value != 0) {
      for (; Value >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    Count = uVar1 ^ 0x1f;
  }
  return Count;
}

Assistant:

static inline unsigned CountLeadingZeros_32(uint32_t Value) {
	unsigned Count; // result
#if __GNUC__ >= 4
	// PowerPC is defined for __builtin_clz(0)
#if !defined(__ppc__) && !defined(__ppc64__)
	if (!Value) return 32;
#endif
	Count = __builtin_clz(Value);
#else
	unsigned Shift;
	if (!Value) return 32;
	Count = 0;
	// bisection method for count leading zeros
	for (Shift = 32 >> 1; Shift; Shift >>= 1) {
		uint32_t Tmp = Value >> Shift;
		if (Tmp) {
			Value = Tmp;
		} else {
			Count |= Shift;
		}
	}
#endif
	return Count;
}